

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

void zng_fill_window(deflate_state *s)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  
  uVar1 = s->w_size;
  uVar3 = s->lookahead;
  while( true ) {
    uVar3 = s->window_size - (uVar3 + s->strstart);
    if (s->w_size + (uVar1 - 0x106) <= s->strstart) {
      memcpy(s->window,s->window + uVar1,(ulong)uVar1);
      if (s->match_start < uVar1) {
        s->prev_length = 0;
        uVar2 = 0;
      }
      else {
        uVar2 = s->match_start - uVar1;
      }
      s->match_start = uVar2;
      uVar2 = s->strstart - uVar1;
      s->strstart = uVar2;
      s->block_start = s->block_start - uVar1;
      if (uVar2 < s->insert) {
        s->insert = uVar2;
      }
      (*functable.slide_hash)(s);
      uVar3 = uVar3 + uVar1;
    }
    if (s->strm->avail_in == 0) break;
    uVar3 = zng_read_buf(s->strm,s->window + (ulong)s->lookahead + (ulong)s->strstart,uVar3);
    uVar3 = uVar3 + s->lookahead;
    s->lookahead = uVar3;
    uVar2 = s->insert;
    if (2 < uVar2 + uVar3) {
      uVar5 = s->strstart - uVar2;
      if (s->max_chain_length < 0x401) {
        if (s->strstart != uVar2) {
          (*s->quick_insert_string)(s,uVar5 - 1);
        }
      }
      else {
        uVar4 = (*s->update_hash)((uint)s->window[uVar5],(uint)s->window[uVar5 + 1]);
        s->ins_h = uVar4;
      }
      uVar4 = s->insert;
      uVar3 = s->lookahead;
      if (uVar3 == 1) {
        uVar4 = uVar4 - 1;
      }
      if (uVar4 != 0) {
        (*s->insert_string)(s,uVar5,uVar4);
        s->insert = s->insert - uVar4;
        uVar3 = s->lookahead;
      }
    }
    if ((0x105 < uVar3) || (s->strm->avail_in == 0)) break;
  }
  uVar1 = s->high_water;
  uVar3 = s->window_size;
  if (uVar1 < uVar3) {
    uVar2 = s->lookahead + s->strstart;
    if (uVar1 < uVar2) {
      uVar5 = uVar3 - uVar2;
      if (0x101 < uVar3 - uVar2) {
        uVar5 = 0x102;
      }
      memset(s->window + uVar2,0,(ulong)uVar5);
      uVar5 = uVar5 + uVar2;
    }
    else {
      if (uVar2 + 0x102 <= uVar1) {
        return;
      }
      uVar2 = (uVar2 + 0x102) - uVar1;
      uVar5 = uVar3 - uVar1;
      if (uVar2 < uVar3 - uVar1) {
        uVar5 = uVar2;
      }
      memset(s->window + uVar1,0,(ulong)uVar5);
      uVar5 = uVar5 + s->high_water;
    }
    s->high_water = uVar5;
  }
  return;
}

Assistant:

void Z_INTERNAL PREFIX(fill_window)(deflate_state *s) {
    unsigned n;
    unsigned int more;    /* Amount of free space at the end of the window. */
    unsigned int wsize = s->w_size;

    Assert(s->lookahead < MIN_LOOKAHEAD, "already enough lookahead");

    do {
        more = s->window_size - s->lookahead - s->strstart;

        /* If the window is almost full and there is insufficient lookahead,
         * move the upper half to the lower one to make room in the upper half.
         */
        if (s->strstart >= wsize+MAX_DIST(s)) {
            memcpy(s->window, s->window+wsize, (unsigned)wsize);
            if (s->match_start >= wsize) {
                s->match_start -= wsize;
            } else {
                s->match_start = 0;
                s->prev_length = 0;
            }
            s->strstart    -= wsize; /* we now have strstart >= MAX_DIST */
            s->block_start -= (int)wsize;
            if (s->insert > s->strstart)
                s->insert = s->strstart;
            FUNCTABLE_CALL(slide_hash)(s);
            more += wsize;
        }
        if (s->strm->avail_in == 0)
            break;

        /* If there was no sliding:
         *    strstart <= WSIZE+MAX_DIST-1 && lookahead <= MIN_LOOKAHEAD - 1 &&
         *    more == window_size - lookahead - strstart
         * => more >= window_size - (MIN_LOOKAHEAD-1 + WSIZE + MAX_DIST-1)
         * => more >= window_size - 2*WSIZE + 2
         * In the BIG_MEM or MMAP case (not yet supported),
         *   window_size == input_size + MIN_LOOKAHEAD  &&
         *   strstart + s->lookahead <= input_size => more >= MIN_LOOKAHEAD.
         * Otherwise, window_size == 2*WSIZE so more >= 2.
         * If there was sliding, more >= WSIZE. So in all cases, more >= 2.
         */
        Assert(more >= 2, "more < 2");

        n = PREFIX(read_buf)(s->strm, s->window + s->strstart + s->lookahead, more);
        s->lookahead += n;

        /* Initialize the hash value now that we have some input: */
        if (s->lookahead + s->insert >= STD_MIN_MATCH) {
            unsigned int str = s->strstart - s->insert;
            if (UNLIKELY(s->max_chain_length > 1024)) {
                s->ins_h = s->update_hash(s->window[str], s->window[str+1]);
            } else if (str >= 1) {
                s->quick_insert_string(s, str + 2 - STD_MIN_MATCH);
            }
            unsigned int count = s->insert;
            if (UNLIKELY(s->lookahead == 1)) {
                count -= 1;
            }
            if (count > 0) {
                s->insert_string(s, str, count);
                s->insert -= count;
            }
        }
        /* If the whole input has less than STD_MIN_MATCH bytes, ins_h is garbage,
         * but this is not important since only literal bytes will be emitted.
         */
    } while (s->lookahead < MIN_LOOKAHEAD && s->strm->avail_in != 0);

    /* If the WIN_INIT bytes after the end of the current data have never been
     * written, then zero those bytes in order to avoid memory check reports of
     * the use of uninitialized (or uninitialised as Julian writes) bytes by
     * the longest match routines.  Update the high water mark for the next
     * time through here.  WIN_INIT is set to STD_MAX_MATCH since the longest match
     * routines allow scanning to strstart + STD_MAX_MATCH, ignoring lookahead.
     */
    if (s->high_water < s->window_size) {
        unsigned int curr = s->strstart + s->lookahead;
        unsigned int init;

        if (s->high_water < curr) {
            /* Previous high water mark below current data -- zero WIN_INIT
             * bytes or up to end of window, whichever is less.
             */
            init = s->window_size - curr;
            if (init > WIN_INIT)
                init = WIN_INIT;
            memset(s->window + curr, 0, init);
            s->high_water = curr + init;
        } else if (s->high_water < curr + WIN_INIT) {
            /* High water mark at or above current data, but below current data
             * plus WIN_INIT -- zero out to current data plus WIN_INIT, or up
             * to end of window, whichever is less.
             */
            init = curr + WIN_INIT - s->high_water;
            if (init > s->window_size - s->high_water)
                init = s->window_size - s->high_water;
            memset(s->window + s->high_water, 0, init);
            s->high_water += init;
        }
    }

    Assert((unsigned long)s->strstart <= s->window_size - MIN_LOOKAHEAD,
           "not enough room for search");
}